

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O1

void stack_enqueue_item(stack *stack,stack_item *item)

{
  stack_item *psVar1;
  stack_item *psVar2;
  
  psVar1 = stack->head;
  if (stack->head == (stack_item *)0x0) {
    psVar2 = (stack_item *)&stack->head;
  }
  else {
    do {
      psVar2 = psVar1;
      psVar1 = psVar2->next;
    } while (psVar2->next != (stack_item *)0x0);
  }
  psVar2->next = item;
  stack->length = stack->length + 1;
  return;
}

Assistant:

void stack_enqueue_item(struct stack *stack, struct stack_item *item)
{
        if (!stack_has_item(stack)) {
                stack->head = item;
                ++stack->length;

                return;
        }

        // Need to find last item
        struct stack_item *curr = stack->head;

        while (curr != NULL && curr->next != NULL) {
                curr = curr->next;
        }

        // curr should point to the last item now
        curr->next = item;
        ++stack->length;
}